

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transitions.hpp
# Opt level: O2

event_process_result __thiscall
afsm::transitions::
state_transition_table<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::test::connection_fsm_def::transaction::extended_query,_unsigned_long>
::process_transition_event<afsm::test::events::no_data>
          (state_transition_table<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::test::connection_fsm_def::transaction::extended_query,_unsigned_long>
           *this,no_data *event)

{
  event_process_result eVar1;
  transition_table_type<afsm::test::events::no_data> *ptVar2;
  indexes_tuple<0UL,_1UL,_2UL,_3UL> local_11;
  
  ptVar2 = state_transition_table<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>>,afsm::test::connection_fsm_def::transaction::extended_query,unsigned_long>
           ::transition_table<afsm::test::events::no_data,0ul,1ul,2ul,3ul>(&local_11);
  eVar1 = std::
          function<afsm::actions::event_process_result_(afsm::transitions::state_transition_table<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::test::connection_fsm_def::transaction::extended_query,_unsigned_long>_&,_afsm::test::events::no_data_&&)>
          ::operator()(ptVar2->_M_elems + this->current_state_,this,event);
  return eVar1;
}

Assistant:

actions::event_process_result
    process_transition_event(Event&& event)
    {
        auto const& inv_table = transition_table<Event>( state_indexes{} );
        return inv_table[current_state()](*this, ::std::forward<Event>(event));
    }